

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O3

mapped_type * __thiscall
binlog::detail::SegmentedMap<binlog::EventSource>::find
          (SegmentedMap<binlog::EventSource> *this,key_type *key)

{
  pointer puVar1;
  pointer pvVar2;
  long lVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar8;
  ulong uVar7;
  
  puVar1 = (this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (uVar8 < 2) {
    lVar6 = 0;
  }
  else {
    uVar5 = 1;
    do {
      uVar7 = uVar5;
      if (*key < puVar1[uVar5]) break;
      uVar5 = uVar5 + 1;
      uVar7 = uVar8;
    } while (uVar8 != uVar5);
    lVar6 = uVar7 - 1;
  }
  uVar8 = *key - puVar1[lVar6];
  pvVar2 = (this->_segments).
           super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[lVar6].
                    super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>.
                    _M_impl.super__Vector_impl_data;
  pmVar4 = (mapped_type *)0x0;
  if (uVar8 < (ulong)(((long)*(pointer *)
                              ((long)&pvVar2[lVar6].
                                      super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 3) *
                     -0x2c8590b21642c859)) {
    pmVar4 = (mapped_type *)(uVar8 * 0xb8 + lVar3);
  }
  return pmVar4;
}

Assistant:

const mapped_type* find(const key_type& key) const
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    const Segment& segment = _segments[si];

    if (vi < segment.size())
    {
      return & segment[vi];
    }

    return end();
  }